

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::
Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
Action(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
       *this,ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
             *impl)

{
  __shared_ptr<testing::ActionInterface<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>,void>
            (local_20,impl);
  std::function<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>
  ::
  function<testing::Action<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>::ActionAdapter,void>
            ((function<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>
              *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}